

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *instanceSyntax,string_view moduleName,ASTContext *context
               ,span<const_slang::ast::Expression_*const,_18446744073709551615UL> params,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,NetType *netType)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  type *args;
  type *args_1;
  UninstantiatedDefSymbol *this;
  Scope *scope;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_00000030;
  UninstantiatedDefSymbol *sym;
  type *loc;
  type *name;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_00000100;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_00000108;
  NetType *in_stack_00000110;
  ASTContext *in_stack_00000118;
  HierarchicalInstanceSyntax *in_stack_00000120;
  bitmask<slang::ast::InstanceFlags> in_stack_0000012f;
  Symbol **in_stack_ffffffffffffff48;
  Symbol *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  HierarchicalInstanceSyntax *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::InstanceFlags> local_31 [9];
  SmallVectorBase<const_slang::ast::Symbol_*> *local_28;
  
  local_28 = in_RDX;
  bitmask<slang::ast::InstanceFlags>::bitmask(local_31,None);
  anon_unknown.dwarf_148a967::createImplicitNets
            (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_0000012f,
             in_stack_00000108,in_stack_00000100);
  anon_unknown.dwarf_148a967::getNameLoc(in_stack_ffffffffffffffb0);
  args = std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                     *)0xfc5d82);
  args_1 = std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                       *)0xfc5d91);
  this = BumpAllocator::
         emplace<slang::ast::UninstantiatedDefSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                   ((BumpAllocator *)in_stack_ffffffffffffffb0,args,args_1,in_stack_ffffffffffffff98
                    ,(span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     in_stack_ffffffffffffff90._M_extent_value);
  Symbol::setSyntax(&this->super_Symbol,(SyntaxNode *)local_28);
  scope = not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0xfc5de8);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            (in_stack_00000030,in_R9);
  syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffff90._M_extent_value;
  syntax_00._M_ptr = in_stack_ffffffffffffff88;
  Symbol::setAttributes(in_stack_ffffffffffffff80,scope,syntax_00);
  SmallVectorBase<const_slang::ast::Symbol_*>::push_back(in_RDX,in_stack_ffffffffffffff48);
  return;
}

Assistant:

static void createUninstantiatedDef(Compilation& compilation, const TSyntax& syntax,
                                    const HierarchicalInstanceSyntax* instanceSyntax,
                                    std::string_view moduleName, const ASTContext& context,
                                    std::span<const Expression* const> params,
                                    SmallVectorBase<const Symbol*>& results,
                                    SmallVectorBase<const Symbol*>& implicitNets,
                                    SmallSet<std::string_view, 8>& implicitNetNames,
                                    const NetType& netType) {
    createImplicitNets(*instanceSyntax, context, netType, InstanceFlags::None, implicitNetNames,
                       implicitNets);

    auto [name, loc] = getNameLoc(*instanceSyntax);
    auto sym = compilation.emplace<UninstantiatedDefSymbol>(name, loc, moduleName, params);
    sym->setSyntax(*instanceSyntax);
    sym->setAttributes(*context.scope, syntax.attributes);
    results.push_back(sym);
}